

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

cram_fd * cram_dopen(hFILE *fp,char *filename,char *mode)

{
  char cVar1;
  ushort uVar2;
  int iVar3;
  cram_fd *fd;
  char *pcVar4;
  cram_file_def *pcVar5;
  SAM_hdr *pSVar6;
  long lVar7;
  char *pcVar8;
  refs_t *prVar9;
  cram_metrics *pcVar10;
  byte bVar11;
  uint uVar12;
  SAM_hdr *extraout_RDX;
  SAM_hdr *extraout_RDX_00;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  char (*__s) [32];
  bool bVar18;
  
  fd = (cram_fd *)calloc(1,0x8900);
  if (fd == (cram_fd *)0x0) {
    return (cram_fd *)0x0;
  }
  fd->level = 5;
  pcVar4 = mode;
  do {
    if (*pcVar4 == '\0') goto LAB_00129c2a;
    bVar11 = *pcVar4 - 0x30;
    pcVar4 = pcVar4 + 1;
  } while (9 < bVar11);
  fd->level = (uint)bVar11;
LAB_00129c2a:
  fd->fp = fp;
  cVar1 = *mode;
  fd->mode = (int)cVar1;
  if (cVar1 == 0x72) {
    pcVar5 = cram_read_file_def(fd);
    fd->file_def = pcVar5;
    if (pcVar5 == (cram_file_def *)0x0) goto LAB_0012a106;
    uVar2._0_1_ = pcVar5->major_version;
    uVar2._1_1_ = pcVar5->minor_version;
    fd->version = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
    pSVar6 = cram_read_SAM_hdr(fd);
    fd->header = pSVar6;
    if (pSVar6 == (SAM_hdr *)0x0) goto LAB_0012a106;
    bVar18 = (fd->version & 0xffffff00U) == 0x100;
  }
  else {
    pcVar5 = (cram_file_def *)calloc(1,0x1a);
    if (pcVar5 == (cram_file_def *)0x0) {
      return (cram_fd *)0x0;
    }
    fd->file_def = pcVar5;
    builtin_strncpy(pcVar5->magic,"CRAM",4);
    strncpy(pcVar5->file_id,filename,0x14);
    fd->version = 0x201;
    bVar18 = false;
  }
  memset(fd->L1,4,0x100);
  uVar17 = 0;
  fd->L1[0x41] = '\0';
  fd->L1[0x61] = '\0';
  fd->L1[0x43] = '\x01';
  fd->L1[99] = '\x01';
  fd->L1[0x47] = '\x02';
  fd->L1[0x67] = '\x02';
  fd->L1[0x54] = '\x03';
  fd->L1[0x74] = '\x03';
  memset(fd->L2,5,0x100);
  fd->L2[0x41] = '\0';
  fd->L2[0x61] = '\0';
  fd->L2[0x43] = '\x01';
  fd->L2[99] = '\x01';
  fd->L2[0x47] = '\x02';
  fd->L2[0x67] = '\x02';
  fd->L2[0x54] = '\x03';
  fd->L2[0x74] = '\x03';
  fd->L2[0x4e] = '\x04';
  fd->L2[0x6e] = '\x04';
  if (bVar18) {
    uVar12 = 0;
    uVar13 = 0;
    uVar14 = 0;
    uVar15 = 0;
    for (uVar16 = 0; uVar16 != 0x200; uVar16 = uVar16 + 1) {
      fd->bam_flag_swap[uVar16] =
           uVar15 & 0x400 | uVar14 & 0x200 |
           uVar13 & 0x100 |
           uVar12 & 0x80 |
           uVar17 & 0x40 |
           (uint)(uVar16 >> 1) & 0x10 |
           (uint)(uVar16 >> 4) & 4 | (uint)(uVar16 >> 6) & 2 | (uint)(0xff < uVar16);
      uVar15 = uVar15 + 0x400;
      uVar14 = uVar14 + 0x100;
      uVar13 = uVar13 + 0x40;
      uVar12 = uVar12 + 0x10;
      uVar17 = uVar17 + 4;
    }
    uVar17 = 0;
    for (uVar16 = 0; uVar16 != 0x1000; uVar16 = uVar16 + 1) {
      uVar12 = (uint)(ushort)(((ushort)uVar16 & 7) << 8) << 4;
      uVar12 = (uVar12 >> 2 & 0x3333) + (uVar12 & 0x3333) * 4;
      fd->cram_flag_swap[uVar16] =
           (uint)(uVar16 >> 10) & 1 |
           (uint)(uVar16 >> 8) & 2 |
           (uint)(uVar16 >> 6) & 4 |
           (uint)(uVar16 >> 4) & 8 | (uint)(uVar16 >> 2) & 0x10 | uVar17 & 0x20 |
           (uVar12 >> 1 & 0x5500) + (uVar12 & 0x5540) * 2 >> 7;
      uVar17 = uVar17 + 2;
    }
  }
  else {
    for (lVar7 = 0; lVar7 != 0x1000; lVar7 = lVar7 + 1) {
      fd->bam_flag_swap[lVar7] = (uint)lVar7;
    }
    for (lVar7 = 0; lVar7 != 0x1000; lVar7 = lVar7 + 1) {
      fd->cram_flag_swap[lVar7] = (uint)lVar7;
    }
  }
  __s = fd->cram_sub_matrix;
  memset(__s,4,0x400);
  for (lVar7 = 0x8435; lVar7 != 0x8835; lVar7 = lVar7 + 0x20) {
    *(undefined1 *)((long)fd->m + lVar7 + -0x80) = 0;
    *(undefined1 *)((long)fd->m + lVar7 + -0x7e) = 1;
    *(undefined1 *)((long)fd->m + lVar7 + -0x7a) = 2;
    *(undefined1 *)((long)fd->m + lVar7 + -0x6d) = 3;
    *(undefined1 *)((long)fd->m + lVar7 + -0x73) = 4;
  }
  for (uVar16 = 0; uVar16 < 0x14; uVar16 = uVar16 + 4) {
    bVar11 = "ACGTN"[uVar16 >> 2];
    for (lVar7 = 0; lVar7 != 0x14; lVar7 = lVar7 + 1) {
      (*__s)[lVar7 + (ulong)((bVar11 & 0x1f) << 5)] = '\x03';
    }
    uVar17 = (bVar11 & 0x1f) << 5;
    (*__s)[(ulong)((byte)"CGTNAGTNACTNACGNACGT"[uVar16] & 0x1f) + (ulong)uVar17] = '\0';
    (*__s)[(ulong)((byte)"CGTNAGTNACTNACGNACGT"[uVar16 + 1] & 0x1f) + (ulong)uVar17] = '\x01';
    (*__s)[(ulong)((byte)"CGTNAGTNACTNACGNACGT"[uVar16 + 2] & 0x1f) + (ulong)uVar17] = '\x02';
    (*__s)[(ulong)((byte)"CGTNAGTNACTNACGNACGT"[uVar16 + 3] & 0x1f) + (ulong)uVar17] = '\x03';
  }
  pcVar8 = strrchr(filename,0x2f);
  pcVar4 = pcVar8 + 1;
  if (pcVar8 == (char *)0x0) {
    pcVar4 = filename;
  }
  pcVar4 = strdup(pcVar4);
  fd->prefix = pcVar4;
  if (pcVar4 != (char *)0x0) {
    fd->first_base = -1;
    fd->last_base = -1;
    fd->record_counter = 0;
    fd->ctr = (cram_container *)0x0;
    prVar9 = refs_create();
    fd->refs = prVar9;
    if (prVar9 != (refs_t *)0x0) {
      fd->ref_id = -2;
      fd->ref = (char *)0x0;
      fd->decode_md = 0;
      fd->verbose = 0;
      fd->seqs_per_slice = 10000;
      fd->slices_per_container = 1;
      fd->embed_ref = 0;
      fd->no_ref = 0;
      fd->ignore_md5 = 0;
      fd->use_bz2 = 0;
      fd->use_rans = (uint)(0x2ff < fd->version);
      fd->use_lzma = 0;
      fd->multi_seq = -1;
      fd->unsorted = 0;
      fd->shared_ref = 0;
      fd->required_fields = 0x7fffffff;
      fd->index = (cram_index *)0x0;
      fd->job_pending = (void *)0x0;
      fd->ooc = 0;
      *(undefined8 *)&fd->own_pool = 0;
      *(undefined8 *)((long)&fd->pool + 4) = 0;
      *(undefined4 *)((long)&fd->rqueue + 4) = 0;
      pSVar6 = extraout_RDX;
      for (lVar7 = 0x10; lVar7 != 0x3f; lVar7 = lVar7 + 1) {
        pcVar10 = cram_new_metrics();
        fd->m[lVar7 + -0x10] = pcVar10;
        pSVar6 = extraout_RDX_00;
      }
      (fd->range).refid = -2;
      fd->eof = 1;
      fd->ref_fn = (char *)0x0;
      fd->bl = (spare_bams *)0x0;
      iVar3 = refs_from_header(fd->refs,(cram_fd *)fd->header,pSVar6);
      if (iVar3 != -1) {
        return fd;
      }
    }
  }
LAB_0012a106:
  free(fd);
  return (cram_fd *)0x0;
}

Assistant:

cram_fd *cram_dopen(hFILE *fp, const char *filename, const char *mode) {
    int i;
    char *cp;
    cram_fd *fd = calloc(1, sizeof(*fd));
    if (!fd)
	return NULL;

    fd->level = 5;
    for (i = 0; mode[i]; i++) {
	if (mode[i] >= '0' && mode[i] <= '9') {
	    fd->level = mode[i] - '0';
	    break;
	}
    }

    fd->fp = fp;
    fd->mode = *mode;
    fd->first_container = 0;

    if (fd->mode == 'r') {
	/* Reader */

	if (!(fd->file_def = cram_read_file_def(fd)))
	    goto err;

	fd->version = fd->file_def->major_version * 256 +
	    fd->file_def->minor_version;

	if (!(fd->header = cram_read_SAM_hdr(fd)))
	    goto err;

    } else {
	/* Writer */
	cram_file_def *def = calloc(1, sizeof(*def));
	if (!def)
	    return NULL;

	fd->file_def = def;

	def->magic[0] = 'C';
	def->magic[1] = 'R';
	def->magic[2] = 'A';
	def->magic[3] = 'M';
	def->major_version = 0; // Indicator to write file def later.
	def->minor_version = 0;
	memset(def->file_id, 0, 20);
	strncpy(def->file_id, filename, 20);

	fd->version = major_version * 256 + minor_version;

	/* SAM header written later along with this file_def */
    }

    cram_init_tables(fd);

    fd->prefix = strdup((cp = strrchr(filename, '/')) ? cp+1 : filename);
    if (!fd->prefix)
	goto err;
    fd->first_base = fd->last_base = -1;
    fd->record_counter = 0;

    fd->ctr = NULL;
    fd->refs  = refs_create();
    if (!fd->refs)
	goto err;
    fd->ref_id = -2;
    fd->ref = NULL;

    fd->decode_md = 0;
    fd->verbose = 0;
    fd->seqs_per_slice = SEQS_PER_SLICE;
    fd->slices_per_container = SLICE_PER_CNT;
    fd->embed_ref = 0;
    fd->no_ref = 0;
    fd->ignore_md5 = 0;
    fd->use_bz2 = 0;
    fd->use_rans = (CRAM_MAJOR_VERS(fd->version) >= 3);
    fd->use_lzma = 0;
    fd->multi_seq = -1;
    fd->unsorted   = 0;
    fd->shared_ref = 0;

    fd->index       = NULL;
    fd->own_pool    = 0;
    fd->pool        = NULL;
    fd->rqueue      = NULL;
    fd->job_pending = NULL;
    fd->ooc         = 0;
    fd->required_fields = INT_MAX;

    for (i = 0; i < DS_END; i++)
	fd->m[i] = cram_new_metrics();

    fd->range.refid = -2; // no ref.
    fd->eof = 1;          // See samtools issue #150
    fd->ref_fn = NULL;

    fd->bl = NULL;

    /* Initialise dummy refs from the @SQ headers */
    if (-1 == refs_from_header(fd->refs, fd, fd->header))
	goto err;

    return fd;

 err:
    if (fd)
	free(fd);

    return NULL;
}